

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structdeclnode.cpp
# Opt level: O1

void __thiscall
StructDeclNode::check
          (StructDeclNode *this,
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          *tables)

{
  string *name;
  pointer pmVar1;
  ArgNode *pAVar2;
  __uniq_ptr_data<TypeNode,_std::default_delete<TypeNode>,_true,_true> _Var3;
  long lVar4;
  bool bVar5;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  pointer puVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
  *this_00;
  string structScope;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_1d8;
  string local_158;
  string local_138;
  SymbolInfo local_118;
  string local_b8;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  name = &this->name;
  bVar5 = wasDeclared(tables,name);
  if (bVar5) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_118.kind,"error: multiple definition of struct \'",name);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_1d8.first._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_1d8.first._M_dataplus._M_p == psVar8) {
      local_1d8.first.field_2._M_allocated_capacity = *psVar8;
      local_1d8.first.field_2._8_8_ = plVar7[3];
      local_1d8.first._M_dataplus._M_p = (pointer)&local_1d8.first.field_2;
    }
    else {
      local_1d8.first.field_2._M_allocated_capacity = *psVar8;
    }
    local_1d8.first._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_1d8);
    *(undefined ***)prVar6 = &PTR__runtime_error_00139738;
    __cxa_throw(prVar6,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = 0;
  if ((long)(tables->
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(tables->
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x30) {
    std::__cxx11::string::_M_replace((ulong)&local_1f8,0,(char *)0x0,0x12bad1);
    pmVar1 = (tables->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"struct","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"???","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_1f8,local_1f8 + local_1f0);
    SymbolInfo::SymbolInfo(&local_118,&local_50,&local_70,&local_90);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
              (&local_1d8,name,&local_118);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)(pmVar1 + -1),&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.second.scope._M_dataplus._M_p != &local_1d8.second.scope.field_2) {
      operator_delete(local_1d8.second.scope._M_dataplus._M_p,
                      local_1d8.second.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.second.type._M_dataplus._M_p != &local_1d8.second.type.field_2) {
      operator_delete(local_1d8.second.type._M_dataplus._M_p,
                      local_1d8.second.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.second.kind._M_dataplus._M_p != &local_1d8.second.kind.field_2) {
      operator_delete(local_1d8.second.kind._M_dataplus._M_p,
                      local_1d8.second.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.first._M_dataplus._M_p != &local_1d8.first.field_2) {
      operator_delete(local_1d8.first._M_dataplus._M_p,
                      local_1d8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.scope._M_dataplus._M_p != &local_118.scope.field_2) {
      operator_delete(local_118.scope._M_dataplus._M_p,
                      local_118.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.type._M_dataplus._M_p != &local_118.type.field_2) {
      operator_delete(local_118.type._M_dataplus._M_p,
                      local_118.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.kind._M_dataplus._M_p != &local_118.kind.field_2) {
      operator_delete(local_118.kind._M_dataplus._M_p,
                      local_118.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
    }
    local_1d8.first.field_2._8_8_ = &local_1d8.first._M_string_length;
    local_1d8.first.field_2._M_allocated_capacity = 0;
    local_1d8.first._M_dataplus._M_p = (pointer)0x0;
    local_1d8.first._M_string_length = 0;
    local_1d8.second.kind._M_string_length = 0;
    local_1d8.second.kind._M_dataplus._M_p = (pointer)local_1d8.first.field_2._8_8_;
    std::
    vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
    ::
    emplace_back<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>
              ((vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
                *)tables,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                *)&local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                 *)&local_1d8);
    puVar9 = (this->fields).
             super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98 = (this->fields).
               super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != local_98) {
      do {
        pmVar1 = (tables->
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pAVar2 = (puVar9->_M_t).super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                 super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                 super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"field","");
        _Var3.super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t.
        super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
        super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl =
             (((puVar9->_M_t).super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
               super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
               super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->type)._M_t.
             super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        lVar4 = *(long *)((long)_Var3.
                                super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t
                                .super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
                                super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,lVar4,
                   *(long *)((long)_Var3.
                                   super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>
                                   .super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl + 0x18) +
                   lVar4);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"local","");
        SymbolInfo::SymbolInfo(&local_118,&local_138,&local_158,&local_b8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
                  (&local_1d8,&(pAVar2->super_VarNode).name,&local_118);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                    *)(pmVar1 + -1),&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.second.scope._M_dataplus._M_p != &local_1d8.second.scope.field_2) {
          operator_delete(local_1d8.second.scope._M_dataplus._M_p,
                          local_1d8.second.scope.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.second.type._M_dataplus._M_p != &local_1d8.second.type.field_2) {
          operator_delete(local_1d8.second.type._M_dataplus._M_p,
                          local_1d8.second.type.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.second.kind._M_dataplus._M_p != &local_1d8.second.kind.field_2) {
          operator_delete(local_1d8.second.kind._M_dataplus._M_p,
                          local_1d8.second.kind.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.first._M_dataplus._M_p != &local_1d8.first.field_2) {
          operator_delete(local_1d8.first._M_dataplus._M_p,
                          local_1d8.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.scope._M_dataplus._M_p != &local_118.scope.field_2) {
          operator_delete(local_118.scope._M_dataplus._M_p,
                          local_118.scope.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.type._M_dataplus._M_p != &local_118.type.field_2) {
          operator_delete(local_118.type._M_dataplus._M_p,
                          local_118.type.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.kind._M_dataplus._M_p != &local_118.kind.field_2) {
          operator_delete(local_118.kind._M_dataplus._M_p,
                          local_118.kind.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != local_98);
    }
    this_00 = &(tables->
               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t;
    (tables->
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~_Rb_tree(this_00);
    return;
  }
  std::__cxx11::string::operator=((string *)&local_1f8,"local");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_118.kind,"error: struct \'",name);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_1d8.first._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_1d8.first._M_dataplus._M_p == psVar8) {
    local_1d8.first.field_2._M_allocated_capacity = *psVar8;
    local_1d8.first.field_2._8_8_ = plVar7[3];
    local_1d8.first._M_dataplus._M_p = (pointer)&local_1d8.first.field_2;
  }
  else {
    local_1d8.first.field_2._M_allocated_capacity = *psVar8;
  }
  local_1d8.first._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::runtime_error::runtime_error(prVar6,(string *)&local_1d8);
  *(undefined ***)prVar6 = &PTR__runtime_error_00139738;
  __cxa_throw(prVar6,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void StructDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, name)) {
        throw SemanticException("error: multiple definition of struct '" + name + "'");
    } else {
        auto structScope = std::string();
        if (tables.size() == 1) {
            structScope = "global";
        } else {
            structScope = "local"; // this is an error
            // TODO: Need to handle methods
            throw SemanticException("error: struct '" + name + "' can only be declared in the global scope");
        }
        tables.back().emplace(std::make_pair(name, SymbolInfo("struct", "???", structScope)));
//        std::cout << "new struct added to table: named " << name << ", scope: " << structScope << "\n";
    }

    // make a new scope for the fields
    tables.push_back(SymbolTable());

    for (const auto& f : fields) {
        tables.back().emplace(std::make_pair(f->name, SymbolInfo("field", f->type->name, "local")));
//        std::cout << "new field added to table: named " << f->name << ", type: "
//                  << f->type->name << ", scope: " << "local" << "\n";
    }

    tables.pop_back();
}